

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostref.c
# Opt level: O2

wasm_ref_t * call_r_r(wasm_func_t *func,wasm_ref_t *ref)

{
  long lVar1;
  wasm_val_t rs [1];
  wasm_val_t vs [1];
  wasm_val_vec_t results;
  wasm_val_vec_t args;
  
  printf("call_r_r... ");
  fflush(_stdout);
  lVar1 = wasm_func_call(func);
  if (lVar1 == 0) {
    puts("okay");
    return (wasm_ref_t *)0x0;
  }
  puts("> Error calling function!");
  exit(1);
}

Assistant:

own wasm_ref_t* call_r_r(const wasm_func_t* func, wasm_ref_t* ref) {
  printf("call_r_r... "); fflush(stdout);
  wasm_val_t vs[1] = { WASM_REF_VAL(ref) };
  wasm_val_t rs[1] = { WASM_INIT_VAL };
  wasm_val_vec_t args = WASM_ARRAY_VEC(vs);
  wasm_val_vec_t results = WASM_ARRAY_VEC(rs);
  if (wasm_func_call(func, &args, &results)) {
    printf("> Error calling function!\n");
    exit(1);
  }
  printf("okay\n");
  return rs[0].of.ref;
}